

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkAssignIDs2(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkCleanCopy(pNtk);
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_24);
    (pAVar3->field_6).iTemp = local_24;
  }
  iVar1 = Abc_NtkNodeNum(pNtk);
  p = Vec_PtrAlloc(iVar1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,local_24);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) {
      iVar1 = Abc_NtkCiNum(pNtk);
      iVar2 = Vec_PtrSize(p);
      (pAVar3->field_6).iTemp = iVar1 + iVar2;
      Vec_PtrPush(p,pAVar3);
    }
  }
  iVar1 = Vec_PtrSize(p);
  iVar2 = Abc_NtkNodeNum(pNtk);
  if (iVar1 == iVar2) {
    for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar3 = Abc_NtkCo(pNtk,local_24);
      iVar1 = Abc_NtkCiNum(pNtk);
      iVar2 = Vec_PtrSize(p);
      (pAVar3->field_6).iTemp = iVar1 + iVar2 + local_24;
    }
    return p;
  }
  __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                ,0x4d,"Vec_Ptr_t *Abc_NtkAssignIDs2(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkAssignIDs2( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    vNodes = Vec_PtrAlloc( Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes);
        Vec_PtrPush( vNodes, pObj );
    }
    assert( Vec_PtrSize(vNodes) == Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + i;
    return vNodes;
}